

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dreadrb.c
# Opt level: O2

void dreadrb(int *nrow,int *ncol,int_t *nonz,double **nzval,int_t **rowind,int_t **colptr)

{
  int *piVar1;
  byte bVar2;
  char cVar3;
  double *pdVar4;
  int_t *addr;
  int_t *addr_00;
  FILE *__stream;
  int iVar5;
  uint uVar6;
  byte *pbVar7;
  long lVar8;
  long lVar9;
  int_t *addr_01;
  int_t *addr_02;
  int_t *addr_03;
  void *addr_04;
  ulong uVar10;
  int_t *piVar11;
  double *pdVar12;
  ulong uVar13;
  long lVar14;
  int_t *piVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  byte *__nptr;
  int iVar19;
  char *__s;
  bool bVar20;
  double dVar21;
  int tmp;
  double **local_210;
  int_t **local_208;
  int_t **local_200;
  long local_1f8;
  int_t *local_1f0;
  int_t *local_1e8;
  int local_1e0;
  int rowsize;
  int rownum;
  int colsize;
  int colnum;
  char type [4];
  char msg [256];
  char buf [100];
  
  __stream = _stdin;
  local_210 = nzval;
  local_208 = rowind;
  local_200 = colptr;
  local_1e8 = nonz;
  fgets(buf,100,_stdin);
  fputs(buf,_stdout);
  iVar5 = 4;
  iVar17 = 0;
  while (iVar19 = iVar5 + -1, iVar5 != 0) {
    __isoc99_fscanf(__stream,"%14c",buf);
    buf[0xe] = '\0';
    __isoc99_sscanf(buf,"%d",&tmp);
    bVar20 = iVar5 == 1;
    iVar5 = iVar19;
    if (bVar20) {
      iVar17 = tmp;
    }
  }
  dDumpLine((FILE *)__stream);
  __isoc99_fscanf(__stream,"%3c",type);
  pbVar7 = (byte *)buf;
  __isoc99_fscanf(__stream,"%11c",pbVar7);
  type[3] = '\0';
  __isoc99_fscanf(__stream,"%14c",pbVar7);
  iVar5 = atoi((char *)pbVar7);
  *nrow = iVar5;
  __isoc99_fscanf(__stream,"%14c",pbVar7);
  iVar5 = atoi((char *)pbVar7);
  *ncol = iVar5;
  __isoc99_fscanf(__stream,"%14c",pbVar7);
  iVar5 = atoi((char *)pbVar7);
  piVar15 = local_1e8;
  *local_1e8 = iVar5;
  __isoc99_fscanf(__stream,"%14c",pbVar7);
  tmp = atoi((char *)pbVar7);
  if (tmp != 0) {
    puts("This is not an assembled matrix!");
  }
  if (*nrow != *ncol) {
    puts("Matrix is not square.");
  }
  dDumpLine((FILE *)__stream);
  dallocateA(*ncol,*piVar15,local_210,local_208,local_200);
  __isoc99_fscanf(__stream,"%16c",pbVar7);
  dParseIntFormat((char *)pbVar7,&colnum,&colsize);
  __isoc99_fscanf(__stream,"%16c",pbVar7);
  dParseIntFormat((char *)pbVar7,&rownum,&rowsize);
  __isoc99_fscanf(__stream,"%20c",pbVar7);
  do {
    bVar2 = *pbVar7;
    pbVar7 = pbVar7 + 1;
  } while (bVar2 != 0x28);
  iVar5 = atoi((char *)pbVar7);
  while( true ) {
    do {
      __nptr = pbVar7 + 1;
      uVar6 = *pbVar7 - 0x44;
      pbVar7 = __nptr;
    } while (0x2c < uVar6);
    if ((0x700000007U >> ((ulong)uVar6 & 0x3f) & 1) != 0) break;
    if ((0x100000001000U >> ((ulong)uVar6 & 0x3f) & 1) != 0) {
      iVar5 = atoi((char *)__nptr);
    }
  }
  for (; (*pbVar7 != 0x29 && (*pbVar7 != 0x2e)); pbVar7 = pbVar7 + 1) {
  }
  *pbVar7 = 0;
  uVar6 = atoi((char *)__nptr);
  dDumpLine((FILE *)__stream);
  ReadVector((FILE *)__stream,*ncol + 1,*local_200,colnum,colsize);
  ReadVector((FILE *)__stream,*piVar15,*local_208,rownum,rowsize);
  if (iVar17 != 0) {
    iVar17 = *piVar15;
    pdVar4 = *local_210;
    lVar16 = 0;
    uVar18 = 0;
    if (0 < (int)uVar6) {
      uVar18 = (ulong)uVar6;
    }
    lVar8 = (long)(int)uVar6;
    while (piVar15 = local_1e8, (int)lVar16 < iVar17) {
      __s = msg;
      fgets(__s,100,__stream);
      lVar9 = 0;
      for (lVar16 = (long)(int)lVar16; (lVar9 < iVar5 && (lVar16 < iVar17)); lVar16 = lVar16 + 1) {
        lVar14 = (lVar9 + 1) * lVar8;
        cVar3 = msg[lVar14];
        msg[lVar14] = '\0';
        for (uVar13 = 0; uVar18 != uVar13; uVar13 = uVar13 + 1) {
          if ((byte)(__s[uVar13] | 0x20U) == 100) {
            __s[uVar13] = 'E';
          }
        }
        dVar21 = atof(msg + lVar9 * lVar8);
        pdVar4[lVar16] = dVar21;
        msg[lVar14] = cVar3;
        __s = __s + lVar8;
        lVar9 = lVar9 + 1;
      }
    }
  }
  if ((type[1] & 0xdfU) == 0x53) {
    uVar6 = *ncol;
    addr = *local_208;
    addr_00 = *local_200;
    pdVar4 = *local_210;
    iVar17 = uVar6 + 1;
    addr_01 = intMalloc(iVar17);
    if (addr_01 == (int_t *)0x0) {
      sprintf(msg,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for marker[]",0xc9,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/dreadrb.c");
      superlu_abort_and_exit(msg);
    }
    addr_02 = intMalloc(iVar17);
    if (addr_02 == (int_t *)0x0) {
      sprintf(msg,"%s at line %d in file %s\n","SUPERLU_MALLOC t_colptr[]",0xcb,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/dreadrb.c");
      superlu_abort_and_exit(msg);
    }
    addr_03 = intMalloc(*piVar15);
    if (addr_03 == (int_t *)0x0) {
      sprintf(msg,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for t_rowind[]",0xcd,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/dreadrb.c");
      superlu_abort_and_exit(msg);
    }
    addr_04 = superlu_malloc((long)*piVar15 << 3);
    if (addr_04 == (void *)0x0) {
      sprintf(msg,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for t_val[]",0xcf,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/dreadrb.c");
      superlu_abort_and_exit(msg);
    }
    uVar18 = 0;
    uVar13 = 0;
    if (0 < (int)uVar6) {
      uVar13 = (ulong)uVar6;
    }
    for (; uVar13 != uVar18; uVar18 = uVar18 + 1) {
      addr_01[uVar18] = 0;
    }
    uVar18 = 0;
    while (uVar18 != uVar13) {
      piVar1 = addr_00 + uVar18;
      uVar18 = uVar18 + 1;
      for (lVar16 = (long)*piVar1; lVar16 < addr_00[uVar18]; lVar16 = lVar16 + 1) {
        addr_01[addr[lVar16]] = addr_01[addr[lVar16]] + 1;
      }
    }
    *addr_02 = 0;
    for (uVar18 = 0; uVar13 != uVar18; uVar18 = uVar18 + 1) {
      addr_02[uVar18 + 1] = addr_01[uVar18] + addr_02[uVar18];
      addr_01[uVar18] = addr_02[uVar18];
    }
    uVar18 = 0;
    while (uVar10 = uVar18, uVar10 != uVar13) {
      for (lVar16 = (long)addr_00[uVar10]; uVar18 = uVar10 + 1, lVar16 < addr_00[uVar10 + 1];
          lVar16 = lVar16 + 1) {
        iVar5 = addr[lVar16];
        addr_03[addr_01[iVar5]] = (int_t)uVar10;
        iVar19 = addr_01[iVar5];
        *(double *)((long)addr_04 + (long)iVar19 * 8) = pdVar4[lVar16];
        addr_01[iVar5] = iVar19 + 1;
      }
    }
    lVar16 = (long)*piVar15 * 2 - (long)(int)uVar6;
    local_1f0 = intMalloc(iVar17);
    local_1f8 = lVar16;
    if (local_1f0 == (int_t *)0x0) {
      sprintf(msg,"%s at line %d in file %s\n","SUPERLU_MALLOC a_colptr[]",0xe8,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/dreadrb.c");
      superlu_abort_and_exit(msg);
    }
    piVar11 = intMalloc((int_t)lVar16);
    if (piVar11 == (int_t *)0x0) {
      sprintf(msg,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for a_rowind[]",0xea,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/dreadrb.c");
      superlu_abort_and_exit(msg);
    }
    pdVar12 = (double *)superlu_malloc(lVar16 * 8);
    if (pdVar12 == (double *)0x0) {
      sprintf(msg,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for a_val[]",0xec,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/dreadrb.c");
      superlu_abort_and_exit(msg);
    }
    *local_1f0 = 0;
    iVar17 = 0;
    uVar18 = 0;
    while (uVar18 != uVar13) {
      uVar10 = uVar18 + 1;
      for (lVar16 = (long)addr_02[uVar18]; lVar16 < addr_02[uVar10]; lVar16 = lVar16 + 1) {
        if (uVar18 != (uint)addr_03[lVar16]) {
          piVar11[iVar17] = addr_03[lVar16];
          pdVar12[iVar17] = *(double *)((long)addr_04 + lVar16 * 8);
          iVar17 = iVar17 + 1;
        }
      }
      lVar16 = (long)addr_00[uVar18];
      local_1e0 = iVar17;
      for (lVar8 = 0; lVar8 + lVar16 < (long)addr_00[uVar10]; lVar8 = lVar8 + 1) {
        piVar11[iVar17 + lVar8] = addr[lVar16 + lVar8];
        dVar21 = pdVar4[lVar16 + lVar8];
        pdVar12[iVar17 + lVar8] = dVar21;
        if (ABS(dVar21) < 4.047e-300) {
          printf("%5d: %e\n",(ulong)(uint)(iVar17 + (int)lVar8));
        }
      }
      iVar17 = local_1e0 + (int)lVar8;
      local_1f0[uVar10] = iVar17;
      uVar18 = uVar10;
      piVar15 = local_1e8;
      lVar16 = local_1f8;
    }
    printf("FormFullA: new_nnz = %lld\n",lVar16);
    superlu_free(pdVar4);
    superlu_free(addr);
    superlu_free(addr_00);
    superlu_free(addr_01);
    superlu_free(addr_04);
    superlu_free(addr_03);
    superlu_free(addr_02);
    *local_210 = pdVar12;
    *local_208 = piVar11;
    *local_200 = local_1f0;
    *piVar15 = (int_t)local_1f8;
  }
  fclose(__stream);
  return;
}

Assistant:

void
dreadrb(int *nrow, int *ncol, int_t *nonz,
        double **nzval, int_t **rowind, int_t **colptr)
{

    register int i, numer_lines = 0;
    int tmp, colnum, colsize, rownum, rowsize, valnum, valsize;
    char buf[100], type[4];
    int sym;
    FILE *fp;

    fp = stdin;

    /* Line 1 */
    fgets(buf, 100, fp);
    fputs(buf, stdout);

    /* Line 2 */
    for (i=0; i<4; i++) {
        fscanf(fp, "%14c", buf); buf[14] = 0;
        sscanf(buf, "%d", &tmp);
        if (i == 3) numer_lines = tmp;
    }
    dDumpLine(fp);

    /* Line 3 */
    fscanf(fp, "%3c", type);
    fscanf(fp, "%11c", buf); /* pad */
    type[3] = 0;
#ifdef DEBUG
    printf("Matrix type %s\n", type);
#endif

    fscanf(fp, "%14c", buf); *nrow = atoi(buf);
    fscanf(fp, "%14c", buf); *ncol = atoi(buf);
    fscanf(fp, "%14c", buf); *nonz = atoi(buf);
    fscanf(fp, "%14c", buf); tmp = atoi(buf);

    if (tmp != 0)
        printf("This is not an assembled matrix!\n");
    if (*nrow != *ncol)
        printf("Matrix is not square.\n");
    dDumpLine(fp);

    /* Allocate storage for the three arrays ( nzval, rowind, colptr ) */
    dallocateA(*ncol, *nonz, nzval, rowind, colptr);

    /* Line 4: format statement */
    fscanf(fp, "%16c", buf);
    dParseIntFormat(buf, &colnum, &colsize);
    fscanf(fp, "%16c", buf);
    dParseIntFormat(buf, &rownum, &rowsize);
    fscanf(fp, "%20c", buf);
    dParseFloatFormat(buf, &valnum, &valsize);
    dDumpLine(fp);

#ifdef DEBUG
    printf("%d rows, %lld nonzeros\n", *nrow, (long long) *nonz);
    printf("colnum %d, colsize %d\n", colnum, colsize);
    printf("rownum %d, rowsize %d\n", rownum, rowsize);
    printf("valnum %d, valsize %d\n", valnum, valsize);
#endif

    ReadVector(fp, *ncol+1, *colptr, colnum, colsize);
    ReadVector(fp, *nonz, *rowind, rownum, rowsize);
    if ( numer_lines ) {
        dReadValues(fp, *nonz, *nzval, valnum, valsize);
    }

    sym = (type[1] == 'S' || type[1] == 's');
    if ( sym ) {
	FormFullA(*ncol, nonz, nzval, rowind, colptr);
    }

    fclose(fp);
}